

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::file::Type<8>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<8> *this,StructureDivision *division,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long *in_R9;
  StructureDivision local_90;
  Base<njoy::ENDFtk::record::Character<66>> local_50 [32];
  
  p_Var1 = &(this->
            super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
            ).sections_._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)
   &(this->
    super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
    ).sections_._M_t._M_impl = 0;
  *(undefined8 *)
   &(this->
    super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
    ).sections_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->
  super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
  ).sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->
  super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
  ).sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->
  super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
  ).sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->
  super_Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
  ).sections_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar3 = (division->tail).fields._M_elems[2];
  uVar2 = iVar3 - 0x1c6;
  if ((uVar2 < 6) && ((0x29U >> (uVar2 & 0x1f) & 1) != 0)) {
    Base<njoy::ENDFtk::file::Type<8>,std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>
    ::read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((map<int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
                *)&local_90,
               (Base<njoy::ENDFtk::file::Type<8>,std::variant<njoy::ENDFtk::section::Type<8,454>,njoy::ENDFtk::section::Type<8,457>,njoy::ENDFtk::section::Type<8,459>>>
                *)division,(StructureDivision *)begin,end,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)lineNumber,in_R9);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
    ::operator=((_Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
                 *)this,(_Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
                         *)&local_90);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>_>_>
                 *)&local_90);
  }
  else {
    if ((division->tail).fields._M_elems[1] == 8) {
      tools::Log::info<char_const*,int,int>
                ("Found unsupported section MF{} MT{} - skipping file",8,iVar3);
      while ((division->tail).fields._M_elems[1] == 8) {
        iVar3 = (division->tail).fields._M_elems[2];
        iVar4 = iVar3;
        while (iVar4 == iVar3) {
          ENDFtk::record::Base<njoy::ENDFtk::record::Character<66>>::
          Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(local_50,begin,end);
          std::__cxx11::string::~string((string *)local_50);
          ENDFtk::record::Tail::Tail<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((Tail *)&local_90,begin,end,lineNumber);
          iVar4 = (int)local_90.base.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                       super__Head_base<4UL,_long,_false>._M_head_impl;
        }
        StructureDivision::
        StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  (&local_90,begin,end,lineNumber);
        StructureDivision::operator=(division,&local_90);
      }
    }
    Base<njoy::ENDFtk::file::Type<8>,_std::variant<njoy::ENDFtk::section::Type<8,_454>,_njoy::ENDFtk::section::Type<8,_457>,_njoy::ENDFtk::section::Type<8,_459>_>_>
    ::verifyFEND(division,*lineNumber);
  }
  return;
}

Assistant:

Type( StructureDivision& division,
      Iterator& begin, const Iterator& end, long& lineNumber ) : Base() {

  //! @todo remove this and set fields and auxiliary functions in Base to private
  try {

    int MT = division.tail.MT();
    if ( ( division.tail.MT() == 454 ) ||
         ( division.tail.MT() == 457 ) ||
         ( division.tail.MT() == 459 ) ) {

      this->sections_ = read( division, begin, end, lineNumber );
    }
    else {

      int MF = 8;
      if ( division.tail.MF() == MF ) {

        Log::info( "Found unsupported section MF{} MT{} - skipping file", MF, MT );

        while ( division.tail.MF() == MF ) {

          Tail tail( division.tail.MAT(), division.tail.MF(), division.tail.MT() );
          int MT = tail.MT();
          while ( tail.MT() == MT ) {

            Text( begin, end );
            tail = Tail( begin, end, lineNumber );
          }
          division = StructureDivision( begin, end, lineNumber );
        }
      }
      this->verifyFEND( division, lineNumber );
    }
  }
  catch ( std::exception& e ) {

    Log::info("Error while reading File 8");
    throw e;
  }
}